

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

bool __thiscall
flatbuffers::go::GoGenerator::generateStructs(GoGenerator *this,string *one_file_code)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppSVar2;
  StructDef *struct_def;
  string declcode;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_28;
  const_iterator it;
  string *one_file_code_local;
  GoGenerator *this_local;
  
  it._M_current = (StructDef **)one_file_code;
  local_28._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    declcode.field_2._8_8_ =
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                   (&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)((long)&declcode.field_2 + 8));
    if (!bVar1) break;
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      ResetImports(this);
    }
    std::__cxx11::string::string((string *)&struct_def);
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_28);
    struct_def_00 = *ppSVar2;
    GenStruct(this,struct_def_00,(string *)&struct_def);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      bVar1 = SaveType(this,&struct_def_00->super_Definition,(string *)&struct_def,true,false);
      if (bVar1) goto LAB_00288f5e;
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&struct_def);
LAB_00288f5e:
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&struct_def);
    if (bVar1) goto LAB_00288f8d;
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_28);
  }
  this_local._7_1_ = 1;
LAB_00288f8d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generateStructs(std::string *one_file_code) {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      if (!parser_.opts.one_file) { ResetImports(); }
      std::string declcode;
      auto &struct_def = **it;
      GenStruct(struct_def, &declcode);
      if (parser_.opts.one_file) {
        *one_file_code += declcode;
      } else {
        if (!SaveType(struct_def, declcode, true, false)) return false;
      }
    }
    return true;
  }